

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O0

void __thiscall gss::innards::SVOBitset::intersect_with_complement(SVOBitset *this,SVOBitset *other)

{
  bool bVar1;
  long *in_RSI;
  SVOBitset *in_RDI;
  uint i_1;
  uint i;
  uint local_18;
  uint local_14;
  
  bVar1 = _is_long(in_RDI);
  if (bVar1) {
    for (local_18 = 0; local_18 < in_RDI->n_words; local_18 = local_18 + 1) {
      (in_RDI->_data).long_data[local_18] =
           (*(ulong *)(*in_RSI + (ulong)local_18 * 8) ^ 0xffffffffffffffff) &
           (in_RDI->_data).long_data[local_18];
    }
  }
  else {
    for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
      (in_RDI->_data).short_data[local_14] =
           (in_RSI[local_14] ^ 0xffffffffffffffffU) & (in_RDI->_data).short_data[local_14];
    }
  }
  return;
}

Assistant:

auto intersect_with_complement(const SVOBitset & other) -> void
        {
            if (! _is_long()) {
                for (unsigned i = 0; i < svo_size; ++i)
                    _data.short_data[i] &= ~other._data.short_data[i];
            }
            else {
                for (unsigned i = 0; i < n_words; ++i)
                    _data.long_data[i] &= ~other._data.long_data[i];
            }
        }